

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRelDecomposes::~IfcRelDecomposes(IfcRelDecomposes *this)

{
  undefined1 *puVar1;
  
  *(undefined ***)&this[-1].field_0x48 = &PTR__IfcRelDecomposes_00844200;
  *(undefined ***)&this->field_0x30 = &PTR__IfcRelDecomposes_00844278;
  *(undefined ***)&this[-1].field_0xd0 = &PTR__IfcRelDecomposes_00844228;
  *(undefined ***)this = &PTR__IfcRelDecomposes_00844250;
  if (*(void **)&this->field_0x18 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x18);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x844390;
  *(undefined8 *)&this->field_0x30 = 0x8443b8;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.
                 field_0x20) {
    operator_delete(puVar1);
  }
  if (*(undefined1 **)&this[-1].field_0x80 != &this[-1].field_0x90) {
    operator_delete(*(undefined1 **)&this[-1].field_0x80);
  }
  if (*(undefined1 **)&this[-1].field_0x58 != &this[-1].field_0x68) {
    operator_delete(*(undefined1 **)&this[-1].field_0x58);
  }
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcRelDecomposes() : Object("IfcRelDecomposes") {}